

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall kratos::IRVisitor::visit_root_tp(IRVisitor *this,IRNode *root)

{
  pointer *pptVar1;
  future<void> *pfVar2;
  pointer ptVar3;
  pointer ppVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar5;
  uint32_t uVar6;
  int iVar7;
  infinite_counter<unsigned_long,_18446744073709551615UL> *__args_1;
  ulong uVar8;
  priority_task *ppVar9;
  pointer ppVar10;
  runtime_error *this_01;
  ulong uVar11;
  future<void> *t_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__fn;
  ulong __n;
  undefined1 this_02 [8];
  infinite_counter<unsigned_long,_18446744073709551615UL> *in_R8;
  undefined1 local_1e0 [8];
  GeneratorGraph graph;
  thread_pool pool;
  undefined1 auStack_a8 [8];
  vector<std::future<void>,_std::allocator<std::future<void>_>_> tasks;
  future<void> t;
  undefined1 local_78 [8];
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> nodes;
  Generator *local_50 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  
  if (root->ast_node_type_ != GeneratorKind) {
    (**this->_vptr_IRVisitor)(this);
    return;
  }
  GeneratorGraph::GeneratorGraph((GeneratorGraph *)local_1e0,(Generator *)root);
  GeneratorGraph::get_nodes
            ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_78,
             (GeneratorGraph *)local_1e0);
  uVar6 = get_num_cpus();
  cxxpool::thread_pool::thread_pool((thread_pool *)&graph.root_,(ulong)uVar6);
  auStack_a8 = (undefined1  [8])0x0;
  tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
            ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)auStack_a8,
             (long)nodes.
                   super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start - (long)local_78 >> 3);
  uVar5 = pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next;
  this_02 = auStack_a8;
  pfVar2 = tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)local_78;
  while( true ) {
    auStack_a8 = this_02;
    tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = pfVar2;
    if (pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next ==
        (__pthread_internal_list *)
        nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      for (; pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
                  (__pthread_internal_list *)uVar5, this_02 != (undefined1  [8])pfVar2;
          this_02 = (undefined1  [8])((long)this_02 + 0x10)) {
        std::future<void>::get((future<void> *)this_02);
        uVar5 = pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next;
      }
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)auStack_a8);
      cxxpool::thread_pool::~thread_pool((thread_pool *)&graph.root_);
      if (local_78 != (undefined1  [8])0x0) {
        operator_delete((void *)local_78,
                        (long)nodes.
                              super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_78);
      }
      std::
      _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_1e0);
      return;
    }
    t.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    local_40->_M_use_count = 1;
    local_40->_M_weak_count = 1;
    local_40->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002adf88;
    __fn = local_40 + 1;
    std::
    __create_task_state<void(),std::_Bind<kratos::IRVisitor::visit_root_tp(kratos::IRNode*)::__0(kratos::Generator*)>,std::allocator<int>>
              ((_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_ir_cc:71:13)_(kratos::Generator_*)>
                *)__fn,(allocator<int> *)
                       &nodes.
                        super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::packaged_task<void_()>::get_future
              ((packaged_task<void_()> *)
               &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)&pool.field_0x80);
    this_00 = local_40;
    if (iVar7 != 0) break;
    if ((char)graph.root_ == '\x01') {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &nodes.
                  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 "push called while pool is shutting down","");
      std::runtime_error::runtime_error
                (this_01,(string *)
                         &nodes.
                          super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *(undefined ***)this_01 = &PTR__runtime_error_002ae0b8;
      __cxa_throw(this_01,&cxxpool::thread_pool_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
    nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)__fn;
    __args_1 = cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>::operator++
                         ((infinite_counter<unsigned_long,_18446744073709551615UL> *)
                          &pool.tasks_.field_0x18);
    ppVar4 = pool.tasks_.c.
             super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptVar3 = pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (pool.tasks_.c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        pool.tasks_.c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if ((long)pool.tasks_.c.
                super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                ._M_impl.super__Vector_impl_data._M_start -
          (long)pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == 0x7fffffffffffffc0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar8 = (long)pool.tasks_.c.
                    super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage >> 6;
      uVar11 = uVar8 + (uVar8 == 0);
      __n = uVar11 + uVar8;
      if (0x1fffffffffffffe < __n) {
        __n = 0x1ffffffffffffff;
      }
      if (CARRY8(uVar11,uVar8)) {
        __n = 0x1ffffffffffffff;
      }
      if (__n == 0) {
        ppVar9 = (priority_task *)0x0;
      }
      else {
        ppVar9 = __gnu_cxx::new_allocator<cxxpool::detail::priority_task>::allocate
                           ((new_allocator<cxxpool::detail::priority_task> *)
                            &pool.threads_.
                             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,__n,(void *)0x0);
      }
      std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
      construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                ((allocator_type *)(ppVar9 + ((long)ppVar4 - (long)ptVar3 >> 6)),
                 (priority_task *)
                 &nodes.
                  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (anon_class_16_1_80eb7a8b *)
                 &t.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(unsigned_long *)__args_1,in_R8);
      pptVar1 = &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      ppVar10 = std::
                vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                ::_S_do_relocate(ptVar3,ppVar4,ppVar9,pptVar1);
      ppVar10 = std::
                vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                ::_S_do_relocate(ppVar4,ppVar4,ppVar10 + 1,pptVar1);
      if (ptVar3 != (pointer)0x0) {
        operator_delete(ptVar3,(long)pool.tasks_.c.
                                     super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar3);
      }
      pool.tasks_.c.
      super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar9 + __n;
      pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)ppVar9;
      pool.tasks_.c.
      super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
      ._M_impl.super__Vector_impl_data._M_start = ppVar10;
    }
    else {
      std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
      construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                ((allocator_type *)
                 pool.tasks_.c.
                 super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (priority_task *)
                 &nodes.
                  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (anon_class_16_1_80eb7a8b *)
                 &t.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(unsigned_long *)__args_1,in_R8);
      pool.tasks_.c.
      super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           pool.tasks_.c.
           super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    std::
    push_heap<__gnu_cxx::__normal_iterator<cxxpool::detail::priority_task*,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>>,std::less<cxxpool::detail::priority_task>>
              (pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               pool.tasks_.c.
               super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pool.field_0x80);
    std::condition_variable::notify_one();
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)auStack_a8,
               (future<void> *)
               &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (t.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 t.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    uVar5 = pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next;
    this_02 = auStack_a8;
    pfVar2 = tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)
         &(pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next)->__next;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

void IRVisitor::visit_root_tp(kratos::IRNode *root) {
    if (root->ir_node_kind() != IRNodeKind::GeneratorKind) {
        // nothing we can do
        visit_root(root);
        return;
    }
    auto *gen = reinterpret_cast<Generator *>(root);
    GeneratorGraph graph(gen);

    auto nodes = graph.get_nodes();
    uint32_t num_cpus = get_num_cpus();
    cxxpool::thread_pool pool{num_cpus};
    std::vector<std::future<void>> tasks;
    tasks.reserve(nodes.size());

    for (auto *mod : nodes) {
        auto t = pool.push(
            [this](Generator *g) {
                if (g->external() || g->is_cloned()) return;
                g->accept(this);
                uint64_t count = 0;
                while (count < g->child_count()) {
                    auto *child = g->get_child(count);
                    if (child->ir_node_kind() != IRNodeKind::GeneratorKind) {
                        visit_root_s(child);
                    }
                    if (count < g->child_count() && child == g->get_child(count)) {
                        count++;
                    }
                }
            },
            mod);
        tasks.emplace_back(std::move(t));
    }

    for (auto &t : tasks) {
        t.get();
    }
}